

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddMisc.c
# Opt level: O3

DdNode * extraZddPrimes(DdManager *dd,DdNode *F)

{
  int *piVar1;
  DdNode *pDVar2;
  DdNode *Q;
  DdNode *P;
  DdNode *pDVar3;
  DdNode *n;
  DdNode *pDVar4;
  int *piVar5;
  ulong uVar6;
  DdNode *zC0;
  
  pDVar2 = dd->one;
  if ((DdNode *)((ulong)pDVar2 ^ 1) == F) {
    return dd->zero;
  }
  if (pDVar2 == F) {
    return pDVar2;
  }
  pDVar2 = cuddCacheLookup1Zdd(dd,extraZddPrimes,F);
  if (pDVar2 != (DdNode *)0x0) {
    return pDVar2;
  }
  uVar6 = (ulong)((uint)F & 1);
  piVar5 = (int *)((ulong)F & 0xfffffffffffffffe);
  pDVar4 = (DdNode *)(*(ulong *)(piVar5 + 6) ^ uVar6);
  pDVar3 = (DdNode *)(uVar6 ^ *(ulong *)(piVar5 + 4));
  pDVar2 = cuddBddAndRecur(dd,pDVar4,pDVar3);
  if (pDVar2 == (DdNode *)0x0) {
    return (DdNode *)0x0;
  }
  uVar6 = (ulong)pDVar2 & 0xfffffffffffffffe;
  *(int *)(uVar6 + 4) = *(int *)(uVar6 + 4) + 1;
  Q = extraZddPrimes(dd,pDVar4);
  if (Q == (DdNode *)0x0) {
    Cudd_RecursiveDeref(dd,pDVar2);
    return (DdNode *)0x0;
  }
  piVar1 = (int *)(((ulong)Q & 0xfffffffffffffffe) + 4);
  *piVar1 = *piVar1 + 1;
  P = extraZddPrimes(dd,pDVar3);
  if (P == (DdNode *)0x0) {
    Cudd_RecursiveDeref(dd,pDVar2);
LAB_0082081d:
    Cudd_RecursiveDerefZdd(dd,Q);
  }
  else {
    piVar1 = (int *)(((ulong)P & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    if (pDVar2 == pDVar4) {
      *(int *)(uVar6 + 4) = *(int *)(uVar6 + 4) + -1;
      pDVar2 = dd->zero;
      piVar1 = (int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      pDVar4 = cuddZddDiff(dd,P,Q);
      pDVar3 = Q;
joined_r0x00820720:
      Q = pDVar2;
      pDVar2 = pDVar4;
      n = P;
      zC0 = Q;
      if (pDVar4 == (DdNode *)0x0) {
        Cudd_RecursiveDerefZdd(dd,pDVar3);
LAB_00820812:
        Cudd_RecursiveDerefZdd(dd,Q);
        Q = P;
        goto LAB_0082081d;
      }
    }
    else {
      if (pDVar2 != pDVar3) {
        pDVar3 = extraZddPrimes(dd,pDVar2);
        if (pDVar3 == (DdNode *)0x0) {
          Cudd_RecursiveDerefZdd(dd,pDVar2);
        }
        else {
          piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + 1;
          Cudd_RecursiveDeref(dd,pDVar2);
          pDVar2 = cuddZddDiff(dd,Q,pDVar3);
          if (pDVar2 != (DdNode *)0x0) {
            piVar1 = (int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4);
            *piVar1 = *piVar1 + 1;
            Cudd_RecursiveDerefZdd(dd,Q);
            pDVar4 = cuddZddDiff(dd,P,pDVar3);
            goto joined_r0x00820720;
          }
          Cudd_RecursiveDerefZdd(dd,pDVar3);
        }
        goto LAB_00820812;
      }
      *(int *)(uVar6 + 4) = *(int *)(uVar6 + 4) + -1;
      pDVar2 = dd->zero;
      piVar1 = (int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      pDVar4 = cuddZddDiff(dd,Q,P);
      n = Q;
      zC0 = pDVar4;
      pDVar3 = P;
      if (pDVar4 == (DdNode *)0x0) {
        Cudd_RecursiveDerefZdd(dd,P);
        Cudd_RecursiveDerefZdd(dd,pDVar2);
        goto LAB_0082081d;
      }
    }
    piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    Cudd_RecursiveDerefZdd(dd,n);
    pDVar2 = extraComposeCover(dd,zC0,pDVar2,pDVar3,*piVar5);
    if (pDVar2 != (DdNode *)0x0) {
      cuddCacheInsert1(dd,extraZddPrimes,F,pDVar2);
      return pDVar2;
    }
  }
  return (DdNode *)0x0;
}

Assistant:

DdNode* extraZddPrimes( DdManager *dd, DdNode* F )
{
    DdNode *zRes;

    if ( F == Cudd_Not( dd->one ) )
        return dd->zero;
    if ( F == dd->one )
        return dd->one;

    /* check cache */
    zRes = cuddCacheLookup1Zdd(dd, extraZddPrimes, F);
    if (zRes)
        return(zRes);
    {
        /* temporary variables */
        DdNode *bF01, *zP0, *zP1;
        /* three components of the prime set */
        DdNode *zResE, *zResP, *zResN;
        int fIsComp = Cudd_IsComplement( F );

        /* find cofactors of F */
        DdNode * bF0 = Cudd_NotCond( Cudd_E( F ), fIsComp );
        DdNode * bF1 = Cudd_NotCond( Cudd_T( F ), fIsComp );

        /* find the intersection of cofactors */
        bF01 = cuddBddAndRecur( dd, bF0, bF1 );
        if ( bF01 == NULL ) return NULL;
        cuddRef( bF01 );

        /* solve the problems for cofactors */
        zP0 = extraZddPrimes( dd, bF0 );
        if ( zP0 == NULL )
        {
            Cudd_RecursiveDeref( dd, bF01 );
            return NULL;
        }
        cuddRef( zP0 );

        zP1 = extraZddPrimes( dd, bF1 );
        if ( zP1 == NULL )
        {
            Cudd_RecursiveDeref( dd, bF01 );
            Cudd_RecursiveDerefZdd( dd, zP0 );
            return NULL;
        }
        cuddRef( zP1 );

        /* check for local unateness */
        if ( bF01 == bF0 )       /* unate increasing */
        {
            /* intersection is useless */
            cuddDeref( bF01 );
            /* the primes of intersection are the primes of F0 */
            zResE = zP0;
            /* there are no primes with negative var */
            zResN = dd->zero;
            cuddRef( zResN );
            /* primes with positive var are primes of F1 that are not primes of F01 */
            zResP = cuddZddDiff( dd, zP1, zP0 );
            if ( zResP == NULL )  
            {
                Cudd_RecursiveDerefZdd( dd, zResE );
                Cudd_RecursiveDerefZdd( dd, zResN );
                Cudd_RecursiveDerefZdd( dd, zP1 );
                return NULL;
            }
            cuddRef( zResP );
            Cudd_RecursiveDerefZdd( dd, zP1 );
        }
        else if ( bF01 == bF1 ) /* unate decreasing */
        {
            /* intersection is useless */
            cuddDeref( bF01 );
            /* the primes of intersection are the primes of F1 */
            zResE = zP1;
            /* there are no primes with positive var */
            zResP = dd->zero;
            cuddRef( zResP );
            /* primes with negative var are primes of F0 that are not primes of F01 */
            zResN = cuddZddDiff( dd, zP0, zP1 );
            if ( zResN == NULL )  
            {
                Cudd_RecursiveDerefZdd( dd, zResE );
                Cudd_RecursiveDerefZdd( dd, zResP );
                Cudd_RecursiveDerefZdd( dd, zP0 );
                return NULL;
            }
            cuddRef( zResN );
            Cudd_RecursiveDerefZdd( dd, zP0 );
        }
        else /* not unate */
        {
            /* primes without the top var are primes of F10 */
            zResE = extraZddPrimes( dd, bF01 );
            if ( zResE == NULL )  
            {
                Cudd_RecursiveDerefZdd( dd, bF01 );
                Cudd_RecursiveDerefZdd( dd, zP0 );
                Cudd_RecursiveDerefZdd( dd, zP1 );
                return NULL;
            }
            cuddRef( zResE );
            Cudd_RecursiveDeref( dd, bF01 );

            /* primes with the negative top var are those of P0 that are not in F10 */
            zResN = cuddZddDiff( dd, zP0, zResE );
            if ( zResN == NULL )  
            {
                Cudd_RecursiveDerefZdd( dd, zResE );
                Cudd_RecursiveDerefZdd( dd, zP0 );
                Cudd_RecursiveDerefZdd( dd, zP1 );
                return NULL;
            }
            cuddRef( zResN );
            Cudd_RecursiveDerefZdd( dd, zP0 );

            /* primes with the positive top var are those of P1 that are not in F10 */
            zResP = cuddZddDiff( dd, zP1, zResE );
            if ( zResP == NULL )  
            {
                Cudd_RecursiveDerefZdd( dd, zResE );
                Cudd_RecursiveDerefZdd( dd, zResN );
                Cudd_RecursiveDerefZdd( dd, zP1 );
                return NULL;
            }
            cuddRef( zResP );
            Cudd_RecursiveDerefZdd( dd, zP1 );
        }

        zRes = extraComposeCover( dd, zResN, zResP, zResE, Cudd_Regular(F)->index );
        if ( zRes == NULL ) return NULL;

        /* insert the result into cache */
        cuddCacheInsert1(dd, extraZddPrimes, F, zRes);
        return zRes;
    }
}